

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_geo_t * golf_entity_get_geo(golf_entity_t *entity)

{
  if (entity->type == WATER_ENTITY) {
    return (golf_geo_t *)((long)&entity->field_4 + 0x88);
  }
  if (entity->type == GEO_ENTITY) {
    return (golf_geo_t *)((long)&entity->field_4 + 0xb0);
  }
  return (golf_geo_t *)0x0;
}

Assistant:

golf_geo_t *golf_entity_get_geo(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: 
        case HOLE_ENTITY: 
        case BALL_START_ENTITY: 
        case BEGIN_ANIMATION_ENTITY:
        case CAMERA_ZONE_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
        case GEO_ENTITY: {
            return &entity->geo.geo;
        }
        case WATER_ENTITY: {
            return &entity->water.geo;
        }
    }
    return NULL;
}